

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void UpdateW(fixed_y_t *src,fixed_y_t *dst,int w)

{
  uint32_t uVar1;
  uint32_t g;
  uint32_t b;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint32_t Y;
  uint32_t B;
  uint32_t G;
  uint32_t R;
  int i;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    uVar1 = GammaToLinearS((uint)*(ushort *)(in_RDI + (long)local_18 * 2));
    g = GammaToLinearS((uint)*(ushort *)(in_RDI + (long)(in_EDX + local_18) * 2));
    b = GammaToLinearS((uint)*(ushort *)(in_RDI + (long)(in_EDX * 2 + local_18) * 2));
    uVar1 = RGBToGray(uVar1,g,b);
    uVar1 = LinearToGammaS(uVar1);
    *(short *)(in_RSI + (long)local_18 * 2) = (short)uVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateW(const fixed_y_t* src, fixed_y_t* dst, int w) {
  int i;
  for (i = 0; i < w; ++i) {
    const uint32_t R = GammaToLinearS(src[0 * w + i]);
    const uint32_t G = GammaToLinearS(src[1 * w + i]);
    const uint32_t B = GammaToLinearS(src[2 * w + i]);
    const uint32_t Y = RGBToGray(R, G, B);
    dst[i] = (fixed_y_t)LinearToGammaS(Y);
  }
}